

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O3

int Train(void *hPtr,char *input,char *output,TrainingArgs trainArgs,AutotuneArgs autotuneArgs,
         TrainProgressCallback trainCallback,AutotuneProgressCallback autotuneCallback,char *label,
         char *pretrainedVectors,bool debug)

{
  TrainingArgs args_00;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  int64_t iVar4;
  ostream *poVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  size_type sVar10;
  int iVar11;
  TrainingArgs *pTVar12;
  double *pdVar13;
  char *pcVar14;
  AutotuneProgressCallback p_Var15;
  string modelPath;
  string vectorsPath;
  ofstream stream;
  Args args;
  undefined1 in_stack_fffffffffffffb08 [96];
  string local_468;
  FastText *local_448;
  string local_440;
  AutotuneProgressCallback local_420;
  _Any_data local_418;
  code *local_408;
  code *pcStack_400;
  string local_3f8;
  TrainProgressCallback local_3d8;
  char *local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [232];
  ios_base local_2d0 [264];
  undefined1 local_1c8 [56];
  _Alloc_hider local_190;
  size_type local_188;
  _Alloc_hider local_170;
  size_type local_168;
  double local_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  loss_name local_128;
  model_name local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  double local_110;
  _Alloc_hider local_108;
  size_type local_100;
  int local_e8;
  _Alloc_hider local_e0;
  size_type local_d8;
  int local_bc;
  _Alloc_hider local_a0;
  size_type local_98;
  _Alloc_hider local_80;
  size_type local_78;
  int local_60;
  int local_5c;
  _Alloc_hider local_58;
  size_type local_50;
  int local_38;
  
  pTVar12 = &trainArgs;
  pdVar13 = (double *)&stack0xfffffffffffffb08;
  local_448 = (FastText *)hPtr;
  local_420 = autotuneCallback;
  local_3d8 = trainCallback;
  for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar13 = pTVar12->lr;
    pTVar12 = (TrainingArgs *)&pTVar12->lrUpdateRate;
    pdVar13 = pdVar13 + 1;
  }
  args_00.dsub._4_4_ = trainArgs.dsub._4_4_;
  args_00._0_96_ = in_stack_fffffffffffffb08;
  local_3d0 = label;
  CreateArgs((Args *)local_1c8,args_00,autotuneArgs,label,pretrainedVectors);
  if (input == (char *)0x0) {
    input = "";
  }
  local_3c8._0_8_ = local_3b8;
  sVar3 = strlen(input);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,input,input + sVar3);
  std::__cxx11::string::operator=((string *)&local_190,(string *)local_3c8);
  if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
  }
  if (output == (char *)0x0) {
    output = "";
  }
  local_3c8._0_8_ = local_3b8;
  sVar3 = strlen(output);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,output,output + sVar3);
  std::__cxx11::string::operator=((string *)&local_170,(string *)local_3c8);
  if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
  }
  p_Var15 = local_420;
  if (local_188 == 0) {
    iVar11 = -1;
    std::__cxx11::string::_M_replace
              (0x1574d8,0,(char *)_lastError_abi_cxx11_._M_string_length,0x14872e);
  }
  else {
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    sVar3 = strlen(output);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,output,output + sVar3);
    if (local_468._M_string_length == 0) {
      sVar10 = 0;
    }
    else {
      local_3c8._0_8_ = local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,".bin","");
      bVar1 = EndsWith(&local_468,(string *)local_3c8,true);
      bVar2 = true;
      if (!bVar1) {
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,".ftz","");
        bVar2 = EndsWith(&local_468,&local_440,true);
        p_Var15 = local_420;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,
                          CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                   local_440.field_2._M_local_buf[0]) + 1);
          p_Var15 = local_420;
        }
      }
      if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
      }
      sVar10 = local_468._M_string_length;
      if (bVar2 != false) {
        std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_468);
        std::__cxx11::string::operator=((string *)&local_468,(string *)local_3c8);
        sVar10 = local_468._M_string_length;
        if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
          sVar10 = local_468._M_string_length;
        }
      }
    }
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    local_440._M_string_length = 0;
    local_440.field_2._M_local_buf[0] = '\0';
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    local_3f8._M_string_length = 0;
    local_3f8.field_2._M_local_buf[0] = '\0';
    if (sVar10 != 0) {
      bVar1 = fasttext::Args::hasAutotune((Args *)local_1c8);
      if ((bVar1) && (iVar4 = fasttext::Args::getAutotuneModelSize((Args *)local_1c8), iVar4 != -1))
      {
        local_3c8._0_8_ = local_3b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3c8,local_468._M_dataplus._M_p,
                   local_468._M_dataplus._M_p + local_468._M_string_length);
        std::__cxx11::string::append(local_3c8);
      }
      else {
        local_3c8._0_8_ = local_3b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3c8,local_468._M_dataplus._M_p,
                   local_468._M_dataplus._M_p + local_468._M_string_length);
        std::__cxx11::string::append(local_3c8);
      }
      std::__cxx11::string::operator=((string *)&local_440,(string *)local_3c8);
      if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
      }
      local_3c8._0_8_ = local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c8,local_468._M_dataplus._M_p,
                 local_468._M_dataplus._M_p + local_468._M_string_length);
      std::__cxx11::string::append(local_3c8);
      std::__cxx11::string::operator=((string *)&local_3f8,(string *)local_3c8);
      if ((undefined1 *)local_3c8._0_8_ != local_3b8) {
        operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._0_8_ + 1));
      }
    }
    if (debug) {
      std::ofstream::ofstream(local_3c8,"_train.txt",_S_out);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"= eargs",7);
      std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
      std::ostream::put((char)local_3c8);
      std::ostream::flush();
      sVar3 = strlen(input);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,input,sVar3);
      std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
      std::ostream::put((char)local_3c8);
      poVar5 = (ostream *)std::ostream::flush();
      sVar3 = strlen(output);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,output,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      poVar5 = std::ostream::_M_insert<double>(trainArgs.lr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.lrUpdateRate);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.dim);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.ws);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.epoch);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.minCount);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.minCountLabel);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.neg);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.wordNgrams);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.loss);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.model);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.bucket);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.minn);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.maxn);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.thread);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      poVar5 = std::ostream::_M_insert<double>(trainArgs.t);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      pcVar14 = local_3d0;
      if (local_3d0 == (char *)0x0) {
        pcVar14 = "";
      }
      sVar3 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar14,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.verbose);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar5 = (ostream *)std::ostream::flush();
      if (pretrainedVectors == (char *)0x0) {
        pretrainedVectors = "";
      }
      sVar3 = strlen(pretrainedVectors);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pretrainedVectors,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,trainArgs.seed);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      uVar8 = std::ostream::flush();
      poVar5 = std::ostream::_M_insert<unsigned_long>(uVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      uVar8 = std::ostream::flush();
      poVar5 = std::ostream::_M_insert<unsigned_long>(uVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      if (autotuneArgs.validationFile == (char *)0x0) {
        autotuneArgs.validationFile = "";
      }
      sVar3 = strlen(autotuneArgs.validationFile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,autotuneArgs.validationFile,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      if (autotuneArgs.metric == (char *)0x0) {
        autotuneArgs.metric = "";
      }
      sVar3 = strlen(autotuneArgs.metric);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,autotuneArgs.metric,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,autotuneArgs.predictions);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,autotuneArgs.duration);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar5 = (ostream *)std::ostream::flush();
      pcVar14 = "";
      if (autotuneArgs.modelSize != (char *)0x0) {
        pcVar14 = autotuneArgs.modelSize;
      }
      sVar3 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar14,sVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,autotuneArgs.verbose);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"= args",6);
      std::ios::widen((char)(ostream *)local_3c8 + (char)*(undefined8 *)(local_3c8._0_8_ + -0x18));
      std::ostream::put((char)local_3c8);
      std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3c8,local_190._M_p,local_188);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_170._M_p,local_168);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      poVar5 = std::ostream::_M_insert<double>(local_150);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_148);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_144);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_140);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_13c);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_138);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_134);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_130);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_12c);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_128);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_124);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_120);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_11c);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_118);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_114);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      poVar5 = std::ostream::_M_insert<double>(local_110);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_108._M_p,local_100);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_e8);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_e0._M_p,local_d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_bc);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      bVar1 = (bool)std::ostream::flush();
      poVar5 = std::ostream::_M_insert<bool>(bVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      uVar8 = std::ostream::flush();
      poVar5 = std::ostream::_M_insert<unsigned_long>(uVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      uVar8 = std::ostream::flush();
      poVar5 = std::ostream::_M_insert<unsigned_long>(uVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_a0._M_p,local_98);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_80._M_p,local_78);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_60);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_5c);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_58._M_p,local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar6 = (ostream *)std::ostream::flush();
      plVar7 = (long *)std::ostream::operator<<(poVar6,local_38);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      std::ofstream::close();
      local_3c8._0_8_ = _VTT;
      *(undefined8 *)(local_3c8 + *(long *)(_VTT + -0x18)) = _log;
      std::filebuf::~filebuf((filebuf *)(local_3c8 + 8));
      std::ios_base::~ios_base(local_2d0);
      p_Var15 = local_420;
    }
    bVar1 = fasttext::Args::hasAutotune((Args *)local_1c8);
    if (bVar1) {
      fasttext::Autotune::Autotune((Autotune *)local_3c8,local_448);
      local_408 = (code *)0x0;
      pcStack_400 = (code *)0x0;
      local_418._M_unused._M_object = (AutotuneProgressCallback)0x0;
      local_418._8_8_ = 0;
      if (p_Var15 != (AutotuneProgressCallback)0x0) {
        pcStack_400 = std::
                      _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                      ::_M_invoke;
        local_408 = std::
                    _Function_handler<void_(double,_int,_double,_double),_void_(*)(double,_int,_double,_double)>
                    ::_M_manager;
        local_418._M_unused._M_object = p_Var15;
      }
      fasttext::Autotune::train
                ((Autotune *)local_3c8,(Args *)local_1c8,(AutotuneCallback *)&local_418);
      if (local_408 != (code *)0x0) {
        (*local_408)(&local_418,&local_418,__destroy_functor);
      }
      fasttext::Autotune::~Autotune((Autotune *)local_3c8);
    }
    else {
      local_3b8._0_8_ = (code *)0x0;
      local_3b8._8_8_ = (code *)0x0;
      local_3c8._0_8_ = (TrainProgressCallback)0x0;
      local_3c8._8_8_ = 0.0;
      if (local_3d8 != (TrainProgressCallback)0x0) {
        local_3c8._0_8_ = local_3d8;
        local_3b8._8_8_ =
             std::
             _Function_handler<void_(float,_float,_double,_double,_long),_void_(*)(float,_float,_double,_double,_long)>
             ::_M_invoke;
        local_3b8._0_8_ =
             std::
             _Function_handler<void_(float,_float,_double,_double,_long),_void_(*)(float,_float,_double,_double,_long)>
             ::_M_manager;
      }
      fasttext::FastText::train(local_448,(Args *)local_1c8,(TrainCallback *)local_3c8);
      if ((code *)local_3b8._0_8_ != (code *)0x0) {
        (*(code *)local_3b8._0_8_)(local_3c8,local_3c8,3);
      }
    }
    if (local_440._M_string_length != 0) {
      fasttext::FastText::saveModel(local_448,&local_440);
    }
    if (local_3f8._M_string_length != 0) {
      fasttext::FastText::saveVectors(local_448,&local_3f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                               local_3f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,
                      CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                               local_440.field_2._M_local_buf[0]) + 1);
    }
    iVar11 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      iVar11 = 0;
    }
  }
  fasttext::Args::~Args((Args *)local_1c8);
  return iVar11;
}

Assistant:

Train(void* hPtr, const char* input, const char* output, TrainingArgs trainArgs, AutotuneArgs autotuneArgs,
        TrainProgressCallback trainCallback, AutotuneProgressCallback autotuneCallback,
        const char* label, const char* pretrainedVectors, bool debug)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto args = CreateArgs(trainArgs, autotuneArgs, label, pretrainedVectors);
    args.input = std::string(EMPTYIFNULL(input));
    args.output = std::string(EMPTYIFNULL(output));

    if (args.input.empty())
    {
        _lastError = "Empty input file specified!";
        return -1;
    }

    std::string outPath(EMPTYIFNULL(output));
    if (!outPath.empty() && (EndsWith(outPath, ".bin", true) || EndsWith(outPath, ".ftz", true))) {
        outPath = outPath.substr(0, outPath.length()-4);
    }

    std::string modelPath;
    std::string vectorsPath;

    if (!outPath.empty()) {
        modelPath = args.hasAutotune() && args.getAutotuneModelSize() != Args::kUnlimitedModelSize
                         ? outPath + ".ftz"
                         : outPath + ".bin";
        vectorsPath = outPath + ".vec";
    }

    if (debug)
    {
        ofstream stream("_train.txt");
        stream << "= eargs" << endl;

        stream << EMPTYIFNULL(input) << endl
            << EMPTYIFNULL(output) << endl
            << trainArgs.lr << endl
            << trainArgs.lrUpdateRate << endl
            << trainArgs.dim << endl
            << trainArgs.ws << endl
            << trainArgs.epoch << endl
            << trainArgs.minCount << endl
            << trainArgs.minCountLabel << endl
            << trainArgs.neg << endl
            << trainArgs.wordNgrams << endl
            << (int)trainArgs.loss << endl
            << (int)trainArgs.model << endl
            << trainArgs.bucket << endl
            << trainArgs.minn << endl
            << trainArgs.maxn << endl
            << trainArgs.thread << endl
            << trainArgs.t << endl
            << EMPTYIFNULL(label) << endl
            << trainArgs.verbose << endl
            << EMPTYIFNULL(pretrainedVectors) << endl
            << trainArgs.saveOutput << endl
            << trainArgs.seed << endl
            << trainArgs.qout << endl
            << trainArgs.retrain << endl
            << trainArgs.qnorm << endl
            << trainArgs.cutoff << endl
            << trainArgs.dsub << endl

            << EMPTYIFNULL(autotuneArgs.validationFile) << endl
            << EMPTYIFNULL(autotuneArgs.metric) << endl
            << autotuneArgs.predictions << endl
            << autotuneArgs.duration << endl
            << EMPTYIFNULL(autotuneArgs.modelSize) << endl
            << autotuneArgs.verbose << endl;

        stream << "= args" << endl;

        stream << args.input << endl
            << args.output << endl
            << args.lr << endl
            << args.lrUpdateRate << endl
            << args.dim << endl
            << args.ws << endl
            << args.epoch << endl
            << args.minCount << endl
            << args.minCountLabel << endl
            << args.neg << endl
            << args.wordNgrams << endl
            << (int)args.loss << endl
            << (int)args.model << endl
            << args.bucket << endl
            << args.minn << endl
            << args.maxn << endl
            << args.thread << endl
            << args.t << endl
            << args.label << endl
            << args.verbose << endl
            << args.pretrainedVectors << endl
            << args.saveOutput << endl
            << args.seed << endl
            << args.qout << endl
            << args.retrain << endl
            << args.qnorm << endl
            << args.cutoff << endl
            << args.dsub << endl
            << args.autotuneValidationFile << endl
            << args.autotuneMetric << endl
            << args.autotunePredictions << endl
            << args.autotuneDuration << endl
            << args.autotuneModelSize << endl
            << args.autotuneVerbose << endl;

        stream.close();
    }

    try {
        if (args.hasAutotune())
        {
            Autotune autotune(fastText);
            autotune.train(args, autotuneCallback);
        }
        else
            fastText->train(args, trainCallback);

        if (!modelPath.empty())
            fastText->saveModel(modelPath);

        if (!vectorsPath.empty())
            fastText->saveVectors(vectorsPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}